

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeffects.cpp
# Opt level: O0

void __thiscall QAlphaWidget::run(QAlphaWidget *this,int time)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QCoreApplication *pQVar4;
  QWidget *pQVar5;
  ContextType *context;
  QWidget *pQVar6;
  ulong uVar7;
  long lVar8;
  QRect *this_00;
  undefined4 in_ESI;
  long in_RDI;
  QFlags_conflict1 *pQVar9;
  long in_FS_OFFSET;
  int in_stack_fffffffffffffe78;
  ImageConversionFlag in_stack_fffffffffffffe7c;
  QSize *in_stack_fffffffffffffe80;
  QAlphaWidget *in_stack_fffffffffffffe88;
  QImage *this_01;
  undefined1 enable;
  QWidget *in_stack_fffffffffffffe90;
  QPoint *in_stack_fffffffffffffe98;
  QRect *in_stack_fffffffffffffea0;
  QPixmap *this_02;
  undefined4 in_stack_fffffffffffffed0;
  QWidget *in_stack_fffffffffffffee8;
  Connection local_e8 [2];
  QPixmap local_d8 [24];
  QImage local_c0 [16];
  undefined1 local_b0 [48];
  QImage local_80 [56];
  QPixmap local_48 [24];
  QImage local_30 [24];
  QSize local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined4 *)(in_RDI + 0xa0) = in_ESI;
  if (*(int *)(in_RDI + 0xa0) < 0) {
    *(undefined4 *)(in_RDI + 0xa0) = 0x96;
  }
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x59572e);
  if (bVar1) {
    *(undefined4 *)(in_RDI + 0xa4) = 0;
    QElapsedTimer::start();
    *(undefined1 *)(in_RDI + 0xa8) = 1;
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x59576a);
    QWidget::setAttribute
              (in_stack_fffffffffffffee8,(WidgetAttribute)((ulong)in_RDI >> 0x20),
               SUB81((ulong)in_RDI >> 0x18,0));
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x59578d);
    QWidget::setAttribute
              (in_stack_fffffffffffffee8,(WidgetAttribute)((ulong)in_RDI >> 0x20),
               SUB81((ulong)in_RDI >> 0x18,0));
    pQVar4 = QCoreApplication::instance();
    QObject::installEventFilter((QObject *)pQVar4);
    pQVar5 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x5957bf);
    QWidget::geometry(pQVar5);
    iVar2 = QRect::x((QRect *)0x5957cf);
    pQVar5 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x5957e4);
    QWidget::geometry(pQVar5);
    QRect::y((QRect *)0x5957f4);
    QWidget::move(in_stack_fffffffffffffe90,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                  (int)in_stack_fffffffffffffe88);
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x595815);
    local_10 = QWidget::size((QWidget *)
                             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    iVar3 = QSize::width((QSize *)0x595832);
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x595847);
    local_18 = QWidget::size((QWidget *)
                             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    QSize::height((QSize *)0x595864);
    QWidget::resize(in_stack_fffffffffffffe90,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                    (int)in_stack_fffffffffffffe88);
    pQVar5 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x595885);
    QPoint::QPoint((QPoint *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                   in_stack_fffffffffffffe78);
    QSize::QSize(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
    QRect::QRect(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                 (QSize *)in_stack_fffffffffffffe90);
    QWidget::grab(pQVar5,(QRect *)CONCAT44(iVar3,iVar2));
    QPixmap::toImage();
    QImage::operator=((QImage *)in_stack_fffffffffffffe88,(QImage *)in_stack_fffffffffffffe80);
    QImage::~QImage(local_30);
    QPixmap::~QPixmap(local_48);
    context = (ContextType *)QGuiApplication::primaryScreen();
    pQVar6 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x595946);
    QWidget::geometry(pQVar6);
    iVar2 = QRect::x((QRect *)0x595956);
    pQVar6 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x59596b);
    QWidget::geometry(pQVar6);
    iVar3 = QRect::y((QRect *)0x59597b);
    pQVar6 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x595990);
    QWidget::geometry(pQVar6);
    QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    pQVar6 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x5959b5);
    QWidget::geometry(pQVar6);
    QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    QScreen::grabWindow((ulonglong)(local_b0 + 0x18),(int)context,0,iVar2,iVar3);
    QPixmap::toImage();
    QImage::operator=((QImage *)in_stack_fffffffffffffe88,(QImage *)in_stack_fffffffffffffe80);
    QImage::~QImage(local_80);
    QPixmap::~QPixmap((QPixmap *)(local_b0 + 0x18));
    uVar7 = QImage::isNull();
    if (((uVar7 & 1) == 0) &&
       (lVar8 = QElapsedTimer::elapsed(), lVar8 < *(int *)(in_RDI + 0xa0) / 2)) {
      this_00 = (QRect *)(in_RDI + 0x48);
      this_01 = local_c0;
      QRect::QRect(this_00);
      pQVar6 = (QWidget *)local_b0;
      QImage::copy((QRect *)pQVar6);
      pQVar9 = (QFlags_conflict1 *)(in_RDI + 0x78);
      QImage::operator=(this_01,(QImage *)this_00);
      iVar3 = (int)in_RDI;
      QImage::~QImage((QImage *)pQVar6);
      QFlags<Qt::ImageConversionFlag>::QFlags
                ((QFlags<Qt::ImageConversionFlag> *)this_00,in_stack_fffffffffffffe7c);
      this_02 = local_d8;
      QPixmap::fromImage((QImage *)this_02,pQVar9);
      QPixmap::operator=((QPixmap *)this_01,(QPixmap *)this_00);
      enable = (undefined1)((ulong)this_01 >> 0x38);
      QPixmap::~QPixmap(this_02);
      QWidget::show(pQVar6);
      QWidget::setEnabled(pQVar6,(bool)enable);
      QObject::connect<void(QTimer::*)(QTimer::QPrivateSignal),void(QAlphaWidget::*)()>
                ((Object *)CONCAT44(iVar2,in_stack_fffffffffffffed0),0,context,
                 (offset_in_QAlphaWidget_to_subr *)pQVar5,AutoConnection);
      QMetaObject::Connection::~Connection(local_e8);
      QTimer::start(iVar3 + 0xb0);
    }
    else {
      *(undefined4 *)(in_RDI + 0xa0) = 0;
      render(in_stack_fffffffffffffe88);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAlphaWidget::run(int time)
{
    duration = time;

    if (duration < 0)
        duration = 150;

    if (!widget)
        return;

    elapsed = 0;
    checkTime.start();

    showWidget = true;
#if defined(Q_OS_WIN)
    qApp->installEventFilter(this);
    widget->setWindowOpacity(0.0);
    widget->show();
    connect(&anim, &QTimer::timeout, this, &QAlphaWidget::render);
    anim.start(1);
#else
    //This is roughly equivalent to calling setVisible(true) without actually showing the widget
    widget->setAttribute(Qt::WA_WState_ExplicitShowHide, true);
    widget->setAttribute(Qt::WA_WState_Hidden, false);

    qApp->installEventFilter(this);

    move(widget->geometry().x(),widget->geometry().y());
    resize(widget->size().width(), widget->size().height());

    frontImage = widget->grab().toImage();
    backImage = QGuiApplication::primaryScreen()->grabWindow(0,
                                widget->geometry().x(), widget->geometry().y(),
                                widget->geometry().width(), widget->geometry().height()).toImage();

    if (!backImage.isNull() && checkTime.elapsed() < duration / 2) {
        mixedImage = backImage.copy();
        pm = QPixmap::fromImage(mixedImage);
        show();
        setEnabled(false);

        connect(&anim, &QTimer::timeout, this, &QAlphaWidget::render);
        anim.start(1);
    } else {
       duration = 0;
       render();
    }
#endif
}